

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall FPlayerNameBox::Drawer(FPlayerNameBox *this,bool selected)

{
  int iVar1;
  BYTE *string;
  size_t sVar2;
  EColorRange *pEVar3;
  int iVar4;
  FPlayerNameBox *this_00;
  
  string = (BYTE *)(this->mText).Chars;
  if (string == (BYTE *)0x0) {
    string = (BYTE *)0x0;
  }
  else {
    if (*string == '$') {
      string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
    }
    pEVar3 = &OptionSettings.mFontColorSelection;
    if (!selected) {
      pEVar3 = &this->mFontColor;
    }
    DCanvas::DrawText((DCanvas *)screen,this->mFont,*pEVar3,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,(char *)string
                      ,0x40001390,1,0);
  }
  iVar4 = (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
  this_00 = (FPlayerNameBox *)this->mFont;
  iVar1 = FFont::StringWidth((FFont *)this_00,string);
  iVar4 = this->mFrameSize + iVar1 + iVar4 + 0x10;
  DrawBorder(this_00,iVar4,
             (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos - this->mFrameSize,0x10
            );
  if (this->mEntering == false) {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,iVar4 + this->mFrameSize,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,
                      this->mPlayerName,0x40001390,1,0);
  }
  else {
    sVar2 = strlen(this->mEditName);
    this->mEditName[sVar2] = SmallFont->Cursor;
    this->mEditName[sVar2 + 1] = '\0';
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,iVar4 + this->mFrameSize,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,
                      this->mEditName,0x40001390,1,0);
    this->mEditName[sVar2] = '\0';
  }
  return;
}

Assistant:

void FPlayerNameBox::Drawer(bool selected)
{
	const char *text = mText;
	if (text != NULL)
	{
		if (*text == '$') text = GStrings(text+1);
		screen->DrawText(mFont, selected? OptionSettings.mFontColorSelection : mFontColor, mXpos, mYpos, text, DTA_Clean, true, TAG_DONE);
	}

	// Draw player name box
	int x = mXpos + mFont->StringWidth(text) + 16 + mFrameSize;
	DrawBorder (x, mYpos - mFrameSize, MAXPLAYERNAME+1);
	if (!mEntering)
	{
		screen->DrawText (SmallFont, CR_UNTRANSLATED, x + mFrameSize, mYpos, mPlayerName,
			DTA_Clean, true, TAG_DONE);
	}
	else
	{
		size_t l = strlen(mEditName);
		mEditName[l] = SmallFont->GetCursor();
		mEditName[l+1] = 0;

		screen->DrawText (SmallFont, CR_UNTRANSLATED, x + mFrameSize, mYpos, mEditName,
			DTA_Clean, true, TAG_DONE);
		
		mEditName[l] = 0;
	}
}